

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 (*pauVar9) [16];
  uint uVar10;
  undefined4 uVar11;
  byte *pbVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  float fVar31;
  float fVar32;
  float fVar40;
  float fVar41;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar43;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar55;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar72;
  float fVar73;
  undefined1 auVar69 [16];
  float fVar74;
  undefined1 auVar70 [16];
  float fVar75;
  undefined1 auVar71 [16];
  float fVar90;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar91;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  float fVar96;
  float fVar97;
  float fVar106;
  undefined1 auVar98 [16];
  float fVar103;
  float fVar105;
  float fVar107;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar102;
  float fVar104;
  undefined1 auVar101 [64];
  float fVar108;
  undefined1 auVar109 [16];
  float fVar116;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar114;
  float fVar115;
  undefined1 auVar113 [64];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [64];
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [64];
  undefined1 auVar125 [64];
  float fVar126;
  undefined1 auVar127 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar128 [64];
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar133 [64];
  float fVar137;
  float fVar138;
  float fVar145;
  undefined1 auVar139 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar146;
  undefined1 auVar140 [64];
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar150 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1261;
  ulong local_1260;
  undefined1 local_1258 [16];
  undefined8 local_1248;
  float fStack_1240;
  float fStack_123c;
  int local_122c;
  undefined1 local_1228 [16];
  undefined1 local_1218 [16];
  undefined8 local_1208;
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [16];
  ulong local_11e8;
  RayHit *local_11e0;
  RayQueryContext *local_11d8;
  long local_11d0;
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  long local_11a0;
  int *local_1198;
  byte *local_1190;
  RTCRayQueryContext *local_1188;
  RayHit *local_1180;
  float *local_1178;
  undefined4 local_1170;
  float local_1168;
  undefined4 local_1164;
  undefined4 local_1160;
  undefined4 local_115c;
  undefined4 local_1158;
  undefined4 local_1154;
  uint local_1150;
  uint local_114c;
  uint local_1148;
  undefined1 local_1138 [16];
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 *local_10e8;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar19 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    auVar89 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    aVar1 = (ray->super_RayK<1>).dir.field_0;
    auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar88._8_4_ = 0x7fffffff;
    auVar88._0_8_ = 0x7fffffff7fffffff;
    auVar88._12_4_ = 0x7fffffff;
    auVar88 = vandps_avx((undefined1  [16])aVar1,auVar88);
    auVar76._8_4_ = 0x219392ef;
    auVar76._0_8_ = 0x219392ef219392ef;
    auVar76._12_4_ = 0x219392ef;
    auVar88 = vcmpps_avx(auVar88,auVar76,1);
    auVar77._8_4_ = 0x3f800000;
    auVar77._0_8_ = 0x3f8000003f800000;
    auVar77._12_4_ = 0x3f800000;
    auVar76 = vdivps_avx(auVar77,(undefined1  [16])aVar1);
    auVar78._8_4_ = 0x5d5e0b6b;
    auVar78._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar78._12_4_ = 0x5d5e0b6b;
    auVar88 = vblendvps_avx(auVar76,auVar78,auVar88);
    auVar69._0_4_ = auVar88._0_4_ * 0.99999964;
    auVar69._4_4_ = auVar88._4_4_ * 0.99999964;
    auVar69._8_4_ = auVar88._8_4_ * 0.99999964;
    auVar69._12_4_ = auVar88._12_4_ * 0.99999964;
    auVar56._0_4_ = auVar88._0_4_ * 1.0000004;
    auVar56._4_4_ = auVar88._4_4_ * 1.0000004;
    auVar56._8_4_ = auVar88._8_4_ * 1.0000004;
    auVar56._12_4_ = auVar88._12_4_ * 1.0000004;
    uVar11 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_fe8._4_4_ = uVar11;
    local_fe8._0_4_ = uVar11;
    local_fe8._8_4_ = uVar11;
    local_fe8._12_4_ = uVar11;
    auVar101 = ZEXT1664(local_fe8);
    uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_ff8._4_4_ = uVar11;
    local_ff8._0_4_ = uVar11;
    local_ff8._8_4_ = uVar11;
    local_ff8._12_4_ = uVar11;
    auVar113 = ZEXT1664(local_ff8);
    uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1008._4_4_ = uVar11;
    local_1008._0_4_ = uVar11;
    local_1008._8_4_ = uVar11;
    local_1008._12_4_ = uVar11;
    auVar119 = ZEXT1664(local_1008);
    local_1018 = vshufps_avx(auVar69,auVar69,0);
    auVar121 = ZEXT1664(local_1018);
    auVar88 = vmovshdup_avx(auVar69);
    local_1028 = vshufps_avx(auVar69,auVar69,0x55);
    auVar125 = ZEXT1664(local_1028);
    auVar76 = vshufpd_avx(auVar69,auVar69,1);
    local_1038 = vshufps_avx(auVar69,auVar69,0xaa);
    auVar128 = ZEXT1664(local_1038);
    local_1048 = vshufps_avx(auVar56,auVar56,0);
    auVar133 = ZEXT1664(local_1048);
    uVar18 = (ulong)(auVar69._0_4_ < 0.0) << 4;
    local_1058 = vshufps_avx(auVar56,auVar56,0x55);
    auVar140 = ZEXT1664(local_1058);
    local_1068 = vshufps_avx(auVar56,auVar56,0xaa);
    auVar150 = ZEXT1664(local_1068);
    uVar17 = (ulong)(auVar88._0_4_ < 0.0) << 4 | 0x20;
    uVar13 = (ulong)(auVar76._0_4_ < 0.0) << 4 | 0x40;
    uVar20 = uVar18 ^ 0x10;
    uVar14 = uVar17 ^ 0x10;
    local_1138 = vshufps_avx(auVar89,auVar89,0);
    auVar95 = ZEXT1664(local_1138);
    auVar88 = vshufps_avx(auVar44,auVar44,0);
    auVar30 = ZEXT1664(auVar88);
    local_1128 = mm_lookupmask_ps._240_8_;
    uStack_1120 = mm_lookupmask_ps._248_8_;
    local_11d8 = context;
    local_11e0 = ray;
    local_11e8 = uVar18;
    local_1260 = uVar17;
LAB_00b66ab9:
    if (pauVar19 != (undefined1 (*) [16])&local_f78) {
      pauVar9 = pauVar19 + -1;
      pauVar19 = pauVar19 + -1;
      if (*(float *)(*pauVar9 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar22 = *(ulong *)*pauVar19;
        while ((uVar22 & 8) == 0) {
          auVar88 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar18),auVar101._0_16_);
          auVar89._0_4_ = auVar121._0_4_ * auVar88._0_4_;
          auVar89._4_4_ = auVar121._4_4_ * auVar88._4_4_;
          auVar89._8_4_ = auVar121._8_4_ * auVar88._8_4_;
          auVar89._12_4_ = auVar121._12_4_ * auVar88._12_4_;
          auVar88 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar17),auVar113._0_16_);
          auVar44._0_4_ = auVar125._0_4_ * auVar88._0_4_;
          auVar44._4_4_ = auVar125._4_4_ * auVar88._4_4_;
          auVar44._8_4_ = auVar125._8_4_ * auVar88._8_4_;
          auVar44._12_4_ = auVar125._12_4_ * auVar88._12_4_;
          auVar88 = vmaxps_avx(auVar89,auVar44);
          auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar13),auVar119._0_16_);
          auVar45._0_4_ = auVar128._0_4_ * auVar76._0_4_;
          auVar45._4_4_ = auVar128._4_4_ * auVar76._4_4_;
          auVar45._8_4_ = auVar128._8_4_ * auVar76._8_4_;
          auVar45._12_4_ = auVar128._12_4_ * auVar76._12_4_;
          auVar76 = vmaxps_avx(auVar45,auVar95._0_16_);
          local_1118 = vmaxps_avx(auVar88,auVar76);
          auVar88 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar20),auVar101._0_16_);
          auVar46._0_4_ = auVar133._0_4_ * auVar88._0_4_;
          auVar46._4_4_ = auVar133._4_4_ * auVar88._4_4_;
          auVar46._8_4_ = auVar133._8_4_ * auVar88._8_4_;
          auVar46._12_4_ = auVar133._12_4_ * auVar88._12_4_;
          auVar88 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar14),auVar113._0_16_);
          auVar57._0_4_ = auVar140._0_4_ * auVar88._0_4_;
          auVar57._4_4_ = auVar140._4_4_ * auVar88._4_4_;
          auVar57._8_4_ = auVar140._8_4_ * auVar88._8_4_;
          auVar57._12_4_ = auVar140._12_4_ * auVar88._12_4_;
          auVar88 = vminps_avx(auVar46,auVar57);
          auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + (uVar13 ^ 0x10)),
                               auVar119._0_16_);
          auVar58._0_4_ = auVar150._0_4_ * auVar76._0_4_;
          auVar58._4_4_ = auVar150._4_4_ * auVar76._4_4_;
          auVar58._8_4_ = auVar150._8_4_ * auVar76._8_4_;
          auVar58._12_4_ = auVar150._12_4_ * auVar76._12_4_;
          auVar76 = vminps_avx(auVar58,auVar30._0_16_);
          auVar88 = vminps_avx(auVar88,auVar76);
          auVar88 = vcmpps_avx(local_1118,auVar88,2);
          uVar10 = vmovmskps_avx(auVar88);
          if (uVar10 == 0) goto LAB_00b66ab9;
          uVar10 = uVar10 & 0xff;
          uVar21 = uVar22 & 0xfffffffffffffff0;
          lVar16 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar22 = *(ulong *)(uVar21 + lVar16 * 8);
          uVar10 = uVar10 - 1 & uVar10;
          if (uVar10 != 0) {
            uVar4 = *(uint *)(local_1118 + lVar16 * 4);
            lVar16 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
              }
            }
            uVar6 = *(ulong *)(uVar21 + lVar16 * 8);
            uVar5 = *(uint *)(local_1118 + lVar16 * 4);
            uVar10 = uVar10 - 1 & uVar10;
            uVar17 = local_1260;
            if (uVar10 == 0) {
              if (uVar4 < uVar5) {
                *(ulong *)*pauVar19 = uVar6;
                *(uint *)(*pauVar19 + 8) = uVar5;
                pauVar19 = pauVar19 + 1;
              }
              else {
                *(ulong *)*pauVar19 = uVar22;
                *(uint *)(*pauVar19 + 8) = uVar4;
                pauVar19 = pauVar19 + 1;
                uVar22 = uVar6;
              }
            }
            else {
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uVar22;
              auVar88 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar4));
              auVar47._8_8_ = 0;
              auVar47._0_8_ = uVar6;
              auVar76 = vpunpcklqdq_avx(auVar47,ZEXT416(uVar5));
              lVar16 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                }
              }
              auVar59._8_8_ = 0;
              auVar59._0_8_ = *(ulong *)(uVar21 + lVar16 * 8);
              auVar44 = vpunpcklqdq_avx(auVar59,ZEXT416(*(uint *)(local_1118 + lVar16 * 4)));
              auVar89 = vpcmpgtd_avx(auVar76,auVar88);
              uVar10 = uVar10 - 1 & uVar10;
              if (uVar10 == 0) {
                auVar56 = vpshufd_avx(auVar89,0xaa);
                auVar89 = vblendvps_avx(auVar76,auVar88,auVar56);
                auVar88 = vblendvps_avx(auVar88,auVar76,auVar56);
                auVar76 = vpcmpgtd_avx(auVar44,auVar89);
                auVar56 = vpshufd_avx(auVar76,0xaa);
                auVar76 = vblendvps_avx(auVar44,auVar89,auVar56);
                auVar89 = vblendvps_avx(auVar89,auVar44,auVar56);
                auVar44 = vpcmpgtd_avx(auVar89,auVar88);
                auVar56 = vpshufd_avx(auVar44,0xaa);
                auVar44 = vblendvps_avx(auVar89,auVar88,auVar56);
                auVar88 = vblendvps_avx(auVar88,auVar89,auVar56);
                *pauVar19 = auVar88;
                pauVar19[1] = auVar44;
                uVar22 = auVar76._0_8_;
                pauVar19 = pauVar19 + 2;
              }
              else {
                lVar16 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                  }
                }
                auVar79._8_8_ = 0;
                auVar79._0_8_ = *(ulong *)(uVar21 + lVar16 * 8);
                auVar69 = vpunpcklqdq_avx(auVar79,ZEXT416(*(uint *)(local_1118 + lVar16 * 4)));
                auVar56 = vpshufd_avx(auVar89,0xaa);
                auVar89 = vblendvps_avx(auVar76,auVar88,auVar56);
                auVar88 = vblendvps_avx(auVar88,auVar76,auVar56);
                auVar76 = vpcmpgtd_avx(auVar69,auVar44);
                auVar56 = vpshufd_avx(auVar76,0xaa);
                auVar76 = vblendvps_avx(auVar69,auVar44,auVar56);
                auVar44 = vblendvps_avx(auVar44,auVar69,auVar56);
                auVar56 = vpcmpgtd_avx(auVar44,auVar88);
                auVar69 = vpshufd_avx(auVar56,0xaa);
                auVar56 = vblendvps_avx(auVar44,auVar88,auVar69);
                auVar88 = vblendvps_avx(auVar88,auVar44,auVar69);
                auVar44 = vpcmpgtd_avx(auVar76,auVar89);
                auVar69 = vpshufd_avx(auVar44,0xaa);
                auVar44 = vblendvps_avx(auVar76,auVar89,auVar69);
                auVar76 = vblendvps_avx(auVar89,auVar76,auVar69);
                auVar89 = vpcmpgtd_avx(auVar56,auVar76);
                auVar69 = vpshufd_avx(auVar89,0xaa);
                auVar89 = vblendvps_avx(auVar56,auVar76,auVar69);
                auVar76 = vblendvps_avx(auVar76,auVar56,auVar69);
                *pauVar19 = auVar88;
                pauVar19[1] = auVar76;
                pauVar19[2] = auVar89;
                auVar95 = ZEXT1664(local_1138);
                uVar22 = auVar44._0_8_;
                pauVar19 = pauVar19 + 3;
              }
            }
          }
        }
        lVar16 = (ulong)((uint)uVar22 & 0xf) - 8;
        uVar22 = uVar22 & 0xfffffffffffffff0;
        for (local_11a0 = 0; local_11a0 != lVar16; local_11a0 = local_11a0 + 1) {
          lVar15 = local_11a0 * 0xb0;
          uVar11 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar34._4_4_ = uVar11;
          auVar34._0_4_ = uVar11;
          auVar34._8_4_ = uVar11;
          auVar34._12_4_ = uVar11;
          uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar48._4_4_ = uVar11;
          auVar48._0_4_ = uVar11;
          auVar48._8_4_ = uVar11;
          auVar48._12_4_ = uVar11;
          uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar60._4_4_ = uVar11;
          auVar60._0_4_ = uVar11;
          auVar60._8_4_ = uVar11;
          auVar60._12_4_ = uVar11;
          local_1228 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + lVar15),auVar34);
          local_11b8 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x10 + lVar15),auVar48);
          local_11c8 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + lVar15),auVar60);
          auVar88 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x30 + lVar15),auVar34);
          local_1218 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x40 + lVar15),auVar48);
          auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x50 + lVar15),auVar60);
          auVar89 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x60 + lVar15),auVar34);
          auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x70 + lVar15),auVar48);
          auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x80 + lVar15),auVar60);
          local_f88 = vsubps_avx(auVar89,local_1228);
          local_f98 = vsubps_avx(auVar44,local_11b8);
          local_fa8 = vsubps_avx(auVar56,local_11c8);
          fVar137 = local_11b8._0_4_;
          fVar31 = fVar137 + auVar44._0_4_;
          fVar141 = local_11b8._4_4_;
          fVar40 = fVar141 + auVar44._4_4_;
          fVar143 = local_11b8._8_4_;
          fVar41 = fVar143 + auVar44._8_4_;
          fVar145 = local_11b8._12_4_;
          fVar43 = fVar145 + auVar44._12_4_;
          fVar120 = local_11c8._0_4_;
          fVar68 = fVar120 + auVar56._0_4_;
          fVar122 = local_11c8._4_4_;
          fVar72 = fVar122 + auVar56._4_4_;
          fVar123 = local_11c8._8_4_;
          fVar73 = fVar123 + auVar56._8_4_;
          fVar124 = local_11c8._12_4_;
          fVar74 = fVar124 + auVar56._12_4_;
          fVar32 = local_fa8._0_4_;
          auVar109._0_4_ = fVar31 * fVar32;
          fVar42 = local_fa8._4_4_;
          auVar109._4_4_ = fVar40 * fVar42;
          fVar90 = local_fa8._8_4_;
          auVar109._8_4_ = fVar41 * fVar90;
          fVar91 = local_fa8._12_4_;
          auVar109._12_4_ = fVar43 * fVar91;
          fVar147 = local_f98._0_4_;
          auVar117._0_4_ = fVar147 * fVar68;
          fVar151 = local_f98._4_4_;
          auVar117._4_4_ = fVar151 * fVar72;
          fVar154 = local_f98._8_4_;
          auVar117._8_4_ = fVar154 * fVar73;
          fVar157 = local_f98._12_4_;
          auVar117._12_4_ = fVar157 * fVar74;
          auVar69 = vsubps_avx(auVar117,auVar109);
          fVar96 = local_1228._0_4_;
          fVar108 = fVar96 + auVar89._0_4_;
          fVar102 = local_1228._4_4_;
          fVar114 = fVar102 + auVar89._4_4_;
          fVar104 = local_1228._8_4_;
          fVar115 = fVar104 + auVar89._8_4_;
          fVar106 = local_1228._12_4_;
          fVar116 = fVar106 + auVar89._12_4_;
          fVar132 = local_f88._0_4_;
          auVar70._0_4_ = fVar132 * fVar68;
          fVar134 = local_f88._4_4_;
          auVar70._4_4_ = fVar134 * fVar72;
          fVar135 = local_f88._8_4_;
          auVar70._8_4_ = fVar135 * fVar73;
          fVar136 = local_f88._12_4_;
          auVar70._12_4_ = fVar136 * fVar74;
          auVar118._0_4_ = fVar108 * fVar32;
          auVar118._4_4_ = fVar114 * fVar42;
          auVar118._8_4_ = fVar115 * fVar90;
          auVar118._12_4_ = fVar116 * fVar91;
          auVar77 = vsubps_avx(auVar118,auVar70);
          auVar110._0_4_ = fVar108 * fVar147;
          auVar110._4_4_ = fVar114 * fVar151;
          auVar110._8_4_ = fVar115 * fVar154;
          auVar110._12_4_ = fVar116 * fVar157;
          auVar35._0_4_ = fVar132 * fVar31;
          auVar35._4_4_ = fVar134 * fVar40;
          auVar35._8_4_ = fVar135 * fVar41;
          auVar35._12_4_ = fVar136 * fVar43;
          auVar78 = vsubps_avx(auVar35,auVar110);
          fVar31 = (ray->super_RayK<1>).dir.field_0.m128[2];
          local_1248._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_1208._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
          local_1258._0_4_ =
               local_1208._4_4_ * auVar69._0_4_ +
               fVar31 * auVar78._0_4_ + local_1248._4_4_ * auVar77._0_4_;
          local_1258._4_4_ =
               local_1208._4_4_ * auVar69._4_4_ +
               fVar31 * auVar78._4_4_ + local_1248._4_4_ * auVar77._4_4_;
          local_1258._8_4_ =
               local_1208._4_4_ * auVar69._8_4_ +
               fVar31 * auVar78._8_4_ + local_1248._4_4_ * auVar77._8_4_;
          local_1258._12_4_ =
               local_1208._4_4_ * auVar69._12_4_ +
               fVar31 * auVar78._12_4_ + local_1248._4_4_ * auVar77._12_4_;
          local_fb8 = vsubps_avx(local_11b8,local_1218);
          local_fc8 = vsubps_avx(local_11c8,auVar76);
          fVar72 = fVar137 + local_1218._0_4_;
          fVar73 = fVar141 + local_1218._4_4_;
          fVar74 = fVar143 + local_1218._8_4_;
          fVar108 = fVar145 + local_1218._12_4_;
          fVar114 = fVar120 + auVar76._0_4_;
          fVar115 = fVar122 + auVar76._4_4_;
          fVar116 = fVar123 + auVar76._8_4_;
          fVar75 = fVar124 + auVar76._12_4_;
          fVar40 = local_fc8._0_4_;
          auVar127._0_4_ = fVar72 * fVar40;
          fVar41 = local_fc8._4_4_;
          auVar127._4_4_ = fVar73 * fVar41;
          fVar43 = local_fc8._8_4_;
          auVar127._8_4_ = fVar74 * fVar43;
          fVar68 = local_fc8._12_4_;
          auVar127._12_4_ = fVar108 * fVar68;
          fVar148 = local_fb8._0_4_;
          auVar139._0_4_ = fVar148 * fVar114;
          fVar152 = local_fb8._4_4_;
          auVar139._4_4_ = fVar152 * fVar115;
          fVar155 = local_fb8._8_4_;
          auVar139._8_4_ = fVar155 * fVar116;
          fVar158 = local_fb8._12_4_;
          auVar139._12_4_ = fVar158 * fVar75;
          auVar69 = vsubps_avx(auVar139,auVar127);
          auVar77 = vsubps_avx(local_1228,auVar88);
          fVar138 = auVar77._0_4_;
          auVar71._0_4_ = fVar138 * fVar114;
          fVar142 = auVar77._4_4_;
          auVar71._4_4_ = fVar142 * fVar115;
          fVar144 = auVar77._8_4_;
          auVar71._8_4_ = fVar144 * fVar116;
          fVar146 = auVar77._12_4_;
          auVar71._12_4_ = fVar146 * fVar75;
          fVar114 = fVar96 + auVar88._0_4_;
          fVar115 = fVar102 + auVar88._4_4_;
          fVar116 = fVar104 + auVar88._8_4_;
          fVar75 = fVar106 + auVar88._12_4_;
          auVar111._0_4_ = fVar114 * fVar40;
          auVar111._4_4_ = fVar115 * fVar41;
          auVar111._8_4_ = fVar116 * fVar43;
          auVar111._12_4_ = fVar75 * fVar68;
          auVar77 = vsubps_avx(auVar111,auVar71);
          auVar98._0_4_ = fVar148 * fVar114;
          auVar98._4_4_ = fVar152 * fVar115;
          auVar98._8_4_ = fVar155 * fVar116;
          auVar98._12_4_ = fVar158 * fVar75;
          auVar36._0_4_ = fVar138 * fVar72;
          auVar36._4_4_ = fVar142 * fVar73;
          auVar36._8_4_ = fVar144 * fVar74;
          auVar36._12_4_ = fVar146 * fVar108;
          auVar78 = vsubps_avx(auVar36,auVar98);
          local_1108._0_4_ =
               local_1208._4_4_ * auVar69._0_4_ +
               fVar31 * auVar78._0_4_ + local_1248._4_4_ * auVar77._0_4_;
          local_1108._4_4_ =
               local_1208._4_4_ * auVar69._4_4_ +
               fVar31 * auVar78._4_4_ + local_1248._4_4_ * auVar77._4_4_;
          local_1108._8_4_ =
               local_1208._4_4_ * auVar69._8_4_ +
               fVar31 * auVar78._8_4_ + local_1248._4_4_ * auVar77._8_4_;
          local_1108._12_4_ =
               local_1208._4_4_ * auVar69._12_4_ +
               fVar31 * auVar78._12_4_ + local_1248._4_4_ * auVar77._12_4_;
          auVar69 = vsubps_avx(auVar88,auVar89);
          fVar97 = auVar88._0_4_ + auVar89._0_4_;
          fVar103 = auVar88._4_4_ + auVar89._4_4_;
          fVar105 = auVar88._8_4_ + auVar89._8_4_;
          fVar107 = auVar88._12_4_ + auVar89._12_4_;
          auVar88 = vsubps_avx(local_1218,auVar44);
          fVar72 = local_1218._0_4_ + auVar44._0_4_;
          fVar73 = local_1218._4_4_ + auVar44._4_4_;
          fVar74 = local_1218._8_4_ + auVar44._8_4_;
          fVar108 = local_1218._12_4_ + auVar44._12_4_;
          auVar89 = vsubps_avx(auVar76,auVar56);
          fVar115 = auVar76._0_4_ + auVar56._0_4_;
          fVar116 = auVar76._4_4_ + auVar56._4_4_;
          fVar75 = auVar76._8_4_ + auVar56._8_4_;
          fVar55 = auVar76._12_4_ + auVar56._12_4_;
          fVar149 = auVar89._0_4_;
          auVar61._0_4_ = fVar149 * fVar72;
          fVar153 = auVar89._4_4_;
          auVar61._4_4_ = fVar153 * fVar73;
          fVar156 = auVar89._8_4_;
          auVar61._8_4_ = fVar156 * fVar74;
          fVar159 = auVar89._12_4_;
          auVar61._12_4_ = fVar159 * fVar108;
          fVar126 = auVar88._0_4_;
          auVar80._0_4_ = fVar126 * fVar115;
          fVar129 = auVar88._4_4_;
          auVar80._4_4_ = fVar129 * fVar116;
          fVar130 = auVar88._8_4_;
          auVar80._8_4_ = fVar130 * fVar75;
          fVar131 = auVar88._12_4_;
          auVar80._12_4_ = fVar131 * fVar55;
          auVar88 = vsubps_avx(auVar80,auVar61);
          fVar114 = auVar69._0_4_;
          auVar49._0_4_ = fVar114 * fVar115;
          fVar115 = auVar69._4_4_;
          auVar49._4_4_ = fVar115 * fVar116;
          fVar116 = auVar69._8_4_;
          auVar49._8_4_ = fVar116 * fVar75;
          fVar75 = auVar69._12_4_;
          auVar49._12_4_ = fVar75 * fVar55;
          auVar81._0_4_ = fVar149 * fVar97;
          auVar81._4_4_ = fVar153 * fVar103;
          auVar81._8_4_ = fVar156 * fVar105;
          auVar81._12_4_ = fVar159 * fVar107;
          auVar76 = vsubps_avx(auVar81,auVar49);
          auVar82._0_4_ = fVar126 * fVar97;
          auVar82._4_4_ = fVar129 * fVar103;
          auVar82._8_4_ = fVar130 * fVar105;
          auVar82._12_4_ = fVar131 * fVar107;
          auVar23._0_4_ = fVar114 * fVar72;
          auVar23._4_4_ = fVar115 * fVar73;
          auVar23._8_4_ = fVar116 * fVar74;
          auVar23._12_4_ = fVar75 * fVar108;
          auVar89 = vsubps_avx(auVar23,auVar82);
          local_1248._0_4_ = local_1248._4_4_;
          fStack_1240 = local_1248._4_4_;
          fStack_123c = local_1248._4_4_;
          local_1208._0_4_ = local_1208._4_4_;
          fStack_1200 = local_1208._4_4_;
          fStack_11fc = local_1208._4_4_;
          auVar24._0_4_ =
               local_1208._4_4_ * auVar88._0_4_ +
               fVar31 * auVar89._0_4_ + local_1248._4_4_ * auVar76._0_4_;
          auVar24._4_4_ =
               local_1208._4_4_ * auVar88._4_4_ +
               fVar31 * auVar89._4_4_ + local_1248._4_4_ * auVar76._4_4_;
          auVar24._8_4_ =
               local_1208._4_4_ * auVar88._8_4_ +
               fVar31 * auVar89._8_4_ + local_1248._4_4_ * auVar76._8_4_;
          auVar24._12_4_ =
               local_1208._4_4_ * auVar88._12_4_ +
               fVar31 * auVar89._12_4_ + local_1248._4_4_ * auVar76._12_4_;
          local_10f8._0_4_ = auVar24._0_4_ + local_1258._0_4_ + local_1108._0_4_;
          local_10f8._4_4_ = auVar24._4_4_ + local_1258._4_4_ + local_1108._4_4_;
          local_10f8._8_4_ = auVar24._8_4_ + local_1258._8_4_ + local_1108._8_4_;
          local_10f8._12_4_ = auVar24._12_4_ + local_1258._12_4_ + local_1108._12_4_;
          auVar88 = vminps_avx(local_1258,local_1108);
          auVar88 = vminps_avx(auVar88,auVar24);
          auVar62._8_4_ = 0x7fffffff;
          auVar62._0_8_ = 0x7fffffff7fffffff;
          auVar62._12_4_ = 0x7fffffff;
          local_1218 = vandps_avx(local_10f8,auVar62);
          auVar63._0_4_ = local_1218._0_4_ * 1.1920929e-07;
          auVar63._4_4_ = local_1218._4_4_ * 1.1920929e-07;
          auVar63._8_4_ = local_1218._8_4_ * 1.1920929e-07;
          auVar63._12_4_ = local_1218._12_4_ * 1.1920929e-07;
          uVar21 = CONCAT44(auVar63._4_4_,auVar63._0_4_);
          auVar83._0_8_ = uVar21 ^ 0x8000000080000000;
          auVar83._8_4_ = -auVar63._8_4_;
          auVar83._12_4_ = -auVar63._12_4_;
          auVar88 = vcmpps_avx(auVar88,auVar83,5);
          auVar76 = vmaxps_avx(local_1258,local_1108);
          auVar76 = vmaxps_avx(auVar76,auVar24);
          auVar76 = vcmpps_avx(auVar76,auVar63,2);
          local_fd8 = vorps_avx(auVar88,auVar76);
          auVar7._8_8_ = uStack_1120;
          auVar7._0_8_ = local_1128;
          auVar7 = auVar7 & local_fd8;
          if ((((auVar7 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar7 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar7 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar7[0xf] < '\0') {
            auVar25._0_4_ = fVar148 * fVar32;
            auVar25._4_4_ = fVar152 * fVar42;
            auVar25._8_4_ = fVar155 * fVar90;
            auVar25._12_4_ = fVar158 * fVar91;
            auVar50._0_4_ = fVar147 * fVar40;
            auVar50._4_4_ = fVar151 * fVar41;
            auVar50._8_4_ = fVar154 * fVar43;
            auVar50._12_4_ = fVar157 * fVar68;
            auVar89 = vsubps_avx(auVar50,auVar25);
            auVar64._0_4_ = fVar126 * fVar40;
            auVar64._4_4_ = fVar129 * fVar41;
            auVar64._8_4_ = fVar130 * fVar43;
            auVar64._12_4_ = fVar131 * fVar68;
            auVar84._0_4_ = fVar148 * fVar149;
            auVar84._4_4_ = fVar152 * fVar153;
            auVar84._8_4_ = fVar155 * fVar156;
            auVar84._12_4_ = fVar158 * fVar159;
            auVar44 = vsubps_avx(auVar84,auVar64);
            auVar99._8_4_ = 0x7fffffff;
            auVar99._0_8_ = 0x7fffffff7fffffff;
            auVar99._12_4_ = 0x7fffffff;
            auVar88 = vandps_avx(auVar25,auVar99);
            auVar76 = vandps_avx(auVar64,auVar99);
            auVar88 = vcmpps_avx(auVar88,auVar76,1);
            local_1098 = vblendvps_avx(auVar44,auVar89,auVar88);
            auVar51._0_4_ = fVar138 * fVar149;
            auVar51._4_4_ = fVar142 * fVar153;
            auVar51._8_4_ = fVar144 * fVar156;
            auVar51._12_4_ = fVar146 * fVar159;
            auVar65._0_4_ = fVar138 * fVar32;
            auVar65._4_4_ = fVar142 * fVar42;
            auVar65._8_4_ = fVar144 * fVar90;
            auVar65._12_4_ = fVar146 * fVar91;
            auVar85._0_4_ = fVar132 * fVar40;
            auVar85._4_4_ = fVar134 * fVar41;
            auVar85._8_4_ = fVar135 * fVar43;
            auVar85._12_4_ = fVar136 * fVar68;
            auVar89 = vsubps_avx(auVar65,auVar85);
            auVar92._0_4_ = fVar40 * fVar114;
            auVar92._4_4_ = fVar41 * fVar115;
            auVar92._8_4_ = fVar43 * fVar116;
            auVar92._12_4_ = fVar68 * fVar75;
            auVar44 = vsubps_avx(auVar92,auVar51);
            auVar88 = vandps_avx(auVar85,auVar99);
            auVar76 = vandps_avx(auVar51,auVar99);
            auVar88 = vcmpps_avx(auVar88,auVar76,1);
            local_1088 = vblendvps_avx(auVar44,auVar89,auVar88);
            auVar37._0_4_ = fVar148 * fVar114;
            auVar37._4_4_ = fVar152 * fVar115;
            auVar37._8_4_ = fVar155 * fVar116;
            auVar37._12_4_ = fVar158 * fVar75;
            auVar66._0_4_ = fVar148 * fVar132;
            auVar66._4_4_ = fVar152 * fVar134;
            auVar66._8_4_ = fVar155 * fVar135;
            auVar66._12_4_ = fVar158 * fVar136;
            auVar86._0_4_ = fVar138 * fVar147;
            auVar86._4_4_ = fVar142 * fVar151;
            auVar86._8_4_ = fVar144 * fVar154;
            auVar86._12_4_ = fVar146 * fVar157;
            auVar93._0_4_ = fVar138 * fVar126;
            auVar93._4_4_ = fVar142 * fVar129;
            auVar93._8_4_ = fVar144 * fVar130;
            auVar93._12_4_ = fVar146 * fVar131;
            auVar89 = vsubps_avx(auVar66,auVar86);
            auVar44 = vsubps_avx(auVar93,auVar37);
            auVar88 = vandps_avx(auVar86,auVar99);
            auVar76 = vandps_avx(auVar37,auVar99);
            auVar88 = vcmpps_avx(auVar88,auVar76,1);
            local_1078 = vblendvps_avx(auVar44,auVar89,auVar88);
            fVar32 = local_1098._0_4_ * local_1208._4_4_ +
                     fVar31 * local_1078._0_4_ + local_1088._0_4_ * local_1248._4_4_;
            fVar40 = local_1098._4_4_ * local_1208._4_4_ +
                     fVar31 * local_1078._4_4_ + local_1088._4_4_ * local_1248._4_4_;
            fVar42 = local_1098._8_4_ * local_1208._4_4_ +
                     fVar31 * local_1078._8_4_ + local_1088._8_4_ * local_1248._4_4_;
            fVar31 = local_1098._12_4_ * local_1208._4_4_ +
                     fVar31 * local_1078._12_4_ + local_1088._12_4_ * local_1248._4_4_;
            auVar38._0_4_ = fVar32 + fVar32;
            auVar38._4_4_ = fVar40 + fVar40;
            auVar38._8_4_ = fVar42 + fVar42;
            auVar38._12_4_ = fVar31 + fVar31;
            fVar41 = local_1098._0_4_ * fVar96 +
                     local_1078._0_4_ * fVar120 + local_1088._0_4_ * fVar137;
            fVar90 = local_1098._4_4_ * fVar102 +
                     local_1078._4_4_ * fVar122 + local_1088._4_4_ * fVar141;
            fVar43 = local_1098._8_4_ * fVar104 +
                     local_1078._8_4_ * fVar123 + local_1088._8_4_ * fVar143;
            fVar91 = local_1098._12_4_ * fVar106 +
                     local_1078._12_4_ * fVar124 + local_1088._12_4_ * fVar145;
            auVar88 = vrcpps_avx(auVar38);
            fVar31 = auVar88._0_4_;
            auVar100._0_4_ = auVar38._0_4_ * fVar31;
            fVar32 = auVar88._4_4_;
            auVar100._4_4_ = auVar38._4_4_ * fVar32;
            fVar40 = auVar88._8_4_;
            auVar100._8_4_ = auVar38._8_4_ * fVar40;
            fVar42 = auVar88._12_4_;
            auVar100._12_4_ = auVar38._12_4_ * fVar42;
            auVar112._8_4_ = 0x3f800000;
            auVar112._0_8_ = 0x3f8000003f800000;
            auVar112._12_4_ = 0x3f800000;
            auVar88 = vsubps_avx(auVar112,auVar100);
            local_10a8._0_4_ = (fVar41 + fVar41) * (fVar31 + fVar31 * auVar88._0_4_);
            local_10a8._4_4_ = (fVar90 + fVar90) * (fVar32 + fVar32 * auVar88._4_4_);
            local_10a8._8_4_ = (fVar43 + fVar43) * (fVar40 + fVar40 * auVar88._8_4_);
            local_10a8._12_4_ = (fVar91 + fVar91) * (fVar42 + fVar42 * auVar88._12_4_);
            auVar30 = ZEXT1664(local_10a8);
            uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar87._4_4_ = uVar11;
            auVar87._0_4_ = uVar11;
            auVar87._8_4_ = uVar11;
            auVar87._12_4_ = uVar11;
            auVar88 = vcmpps_avx(auVar87,local_10a8,2);
            fVar31 = (ray->super_RayK<1>).tfar;
            auVar94._4_4_ = fVar31;
            auVar94._0_4_ = fVar31;
            auVar94._8_4_ = fVar31;
            auVar94._12_4_ = fVar31;
            auVar76 = vcmpps_avx(local_10a8,auVar94,2);
            auVar88 = vandps_avx(auVar88,auVar76);
            auVar76 = vcmpps_avx(auVar38,_DAT_01f45a50,4);
            auVar88 = vandps_avx(auVar76,auVar88);
            auVar8._8_8_ = uStack_1120;
            auVar8._0_8_ = local_1128;
            auVar76 = vandps_avx(local_fd8,auVar8);
            auVar88 = vpslld_avx(auVar88,0x1f);
            auVar89 = vpsrad_avx(auVar88,0x1f);
            auVar88 = auVar76 & auVar89;
            if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar88[0xf] < '\0') {
              auVar2._0_4_ = (ray->super_RayK<1>).tfar;
              auVar2._4_4_ = (ray->super_RayK<1>).mask;
              auVar2._8_4_ = (ray->super_RayK<1>).id;
              auVar2._12_4_ = (ray->super_RayK<1>).flags;
              auVar95 = ZEXT1664(auVar2);
              auVar76 = vandps_avx(auVar89,auVar76);
              local_1118 = local_1258;
              local_10e8 = &local_1261;
              local_10d8 = auVar76;
              local_1208 = (long)context->scene;
              local_11f8 = auVar76;
              auVar88 = vrcpps_avx(local_10f8);
              fVar31 = auVar88._0_4_;
              auVar52._0_4_ = local_10f8._0_4_ * fVar31;
              fVar32 = auVar88._4_4_;
              auVar52._4_4_ = local_10f8._4_4_ * fVar32;
              fVar40 = auVar88._8_4_;
              auVar52._8_4_ = local_10f8._8_4_ * fVar40;
              fVar42 = auVar88._12_4_;
              auVar52._12_4_ = local_10f8._12_4_ * fVar42;
              auVar67._8_4_ = 0x3f800000;
              auVar67._0_8_ = 0x3f8000003f800000;
              auVar67._12_4_ = 0x3f800000;
              auVar88 = vsubps_avx(auVar67,auVar52);
              auVar26._0_4_ = fVar31 + fVar31 * auVar88._0_4_;
              auVar26._4_4_ = fVar32 + fVar32 * auVar88._4_4_;
              auVar26._8_4_ = fVar40 + fVar40 * auVar88._8_4_;
              auVar26._12_4_ = fVar42 + fVar42 * auVar88._12_4_;
              auVar53._8_4_ = 0x219392ef;
              auVar53._0_8_ = 0x219392ef219392ef;
              auVar53._12_4_ = 0x219392ef;
              auVar88 = vcmpps_avx(local_1218,auVar53,5);
              auVar88 = vandps_avx(auVar88,auVar26);
              auVar54._0_4_ = local_1258._0_4_ * auVar88._0_4_;
              auVar54._4_4_ = local_1258._4_4_ * auVar88._4_4_;
              auVar54._8_4_ = local_1258._8_4_ * auVar88._8_4_;
              auVar54._12_4_ = local_1258._12_4_ * auVar88._12_4_;
              local_10c8 = vminps_avx(auVar54,auVar67);
              auVar27._0_4_ = local_1108._0_4_ * auVar88._0_4_;
              auVar27._4_4_ = local_1108._4_4_ * auVar88._4_4_;
              auVar27._8_4_ = local_1108._8_4_ * auVar88._8_4_;
              auVar27._12_4_ = local_1108._12_4_ * auVar88._12_4_;
              local_10b8 = vminps_avx(auVar27,auVar67);
              auVar28._8_4_ = 0x7f800000;
              auVar28._0_8_ = 0x7f8000007f800000;
              auVar28._12_4_ = 0x7f800000;
              auVar88 = vblendvps_avx(auVar28,local_10a8,auVar76);
              auVar89 = vshufps_avx(auVar88,auVar88,0xb1);
              auVar89 = vminps_avx(auVar89,auVar88);
              auVar44 = vshufpd_avx(auVar89,auVar89,1);
              auVar89 = vminps_avx(auVar44,auVar89);
              auVar88 = vcmpps_avx(auVar88,auVar89,0);
              auVar89 = auVar76 & auVar88;
              if ((((auVar89 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar89 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar89 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar89[0xf] < '\0') {
                auVar76 = vandps_avx(auVar88,auVar76);
              }
              uVar10 = vextractps_avx(auVar2,1);
              uVar11 = vmovmskps_avx(auVar76);
              uVar21 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar11);
              pbVar12 = (byte *)0x0;
              if (uVar21 != 0) {
                for (; (uVar21 >> (long)pbVar12 & 1) == 0; pbVar12 = pbVar12 + 1) {
                }
              }
              local_1248 = lVar15 + uVar22;
              lVar15 = lVar15 + uVar22;
LAB_00b67272:
              local_1150 = *(uint *)(lVar15 + 0x90 + (long)pbVar12 * 4);
              lVar15 = *(long *)(*(long *)(local_1208 + 0x1e8) + (ulong)local_1150 * 8);
              if ((*(uint *)(lVar15 + 0x34) & uVar10) == 0) {
                *(undefined4 *)(local_11f8 + (long)pbVar12 * 4) = 0;
              }
              else {
                local_1258._0_8_ = pbVar12;
                local_1218._0_8_ = context->args;
                local_11c8 = auVar95._0_16_;
                if (context->args->filter == (RTCFilterFunctionN)0x0) {
                  local_1188 = context->user;
                  if (*(long *)(lVar15 + 0x40) == 0) {
                    fVar31 = *(float *)(local_10c8 + (long)pbVar12 * 4);
                    fVar32 = *(float *)(local_10b8 + (long)pbVar12 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_10a8 + (long)pbVar12 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_1098 + (long)pbVar12 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_1088 + (long)pbVar12 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_1078 + (long)pbVar12 * 4);
                    ray->u = fVar31;
                    ray->v = fVar32;
                    ray->primID = *(uint *)(local_1248 + 0xa0 + (long)pbVar12 * 4);
                    ray->geomID = local_1150;
                    ray->instID[0] = local_1188->instID[0];
                    ray->instPrimID[0] = local_1188->instPrimID[0];
                    goto LAB_00b6760c;
                  }
                }
                else {
                  local_1188 = context->user;
                }
                local_1168 = *(float *)(local_1098 + (long)pbVar12 * 4);
                local_1164 = *(undefined4 *)(local_1088 + (long)pbVar12 * 4);
                local_1160 = *(undefined4 *)(local_1078 + (long)pbVar12 * 4);
                local_115c = *(undefined4 *)(local_10c8 + (long)pbVar12 * 4);
                local_1158 = *(undefined4 *)(local_10b8 + (long)pbVar12 * 4);
                local_1154 = *(undefined4 *)(local_1248 + 0xa0 + (long)pbVar12 * 4);
                local_114c = local_1188->instID[0];
                local_1148 = local_1188->instPrimID[0];
                (ray->super_RayK<1>).tfar = *(float *)(local_10a8 + (long)pbVar12 * 4);
                local_122c = -1;
                local_1198 = &local_122c;
                pbVar12 = *(byte **)(lVar15 + 0x18);
                local_1190 = pbVar12;
                local_1180 = ray;
                local_1178 = &local_1168;
                local_1170 = 1;
                local_1228._0_8_ = lVar15;
                local_11d0 = lVar16;
                local_11b8 = auVar30._0_16_;
                if (*(code **)(lVar15 + 0x40) == (code *)0x0) {
LAB_00b67490:
                  if ((*(code **)(local_1218._0_8_ + 0x10) != (code *)0x0) &&
                     ((pbVar12 = (byte *)local_1218._0_8_, (*(byte *)local_1218._0_8_ & 2) != 0 ||
                      (pbVar12 = (byte *)local_1228._0_8_,
                      (*(byte *)(local_1228._0_8_ + 0x3e) & 0x40) != 0)))) {
                    (**(code **)(local_1218._0_8_ + 0x10))(&local_1198);
                    auVar30 = ZEXT1664(local_11b8);
                    context = local_11d8;
                    ray = local_11e0;
                    uVar17 = local_1260;
                    uVar18 = local_11e8;
                    if (*local_1198 == 0) goto LAB_00b67553;
                  }
                  (local_1180->Ng).field_0.field_0.x = *local_1178;
                  (local_1180->Ng).field_0.field_0.y = local_1178[1];
                  (local_1180->Ng).field_0.field_0.z = local_1178[2];
                  local_1180->u = local_1178[3];
                  local_1180->v = local_1178[4];
                  local_1180->primID = (uint)local_1178[5];
                  local_1180->geomID = (uint)local_1178[6];
                  local_1180->instID[0] = (uint)local_1178[7];
                  pbVar12 = (byte *)0x0;
                  local_1180->instPrimID[0] = (uint)local_1178[8];
                  lVar16 = local_11d0;
                }
                else {
                  (**(code **)(lVar15 + 0x40))(&local_1198);
                  auVar30 = ZEXT1664(local_11b8);
                  context = local_11d8;
                  ray = local_11e0;
                  uVar17 = local_1260;
                  uVar18 = local_11e8;
                  if (*local_1198 != 0) goto LAB_00b67490;
LAB_00b67553:
                  (local_11e0->super_RayK<1>).tfar = (float)local_11c8._0_4_;
                  context = local_11d8;
                  ray = local_11e0;
                  lVar16 = local_11d0;
                  uVar17 = local_1260;
                  uVar18 = local_11e8;
                }
                *(undefined4 *)(local_11f8 + local_1258._0_8_ * 4) = 0;
                fVar31 = (ray->super_RayK<1>).tfar;
                auVar29._4_4_ = fVar31;
                auVar29._0_4_ = fVar31;
                auVar29._8_4_ = fVar31;
                auVar29._12_4_ = fVar31;
                auVar88 = vcmpps_avx(auVar30._0_16_,auVar29,2);
                local_11f8 = vandps_avx(auVar88,local_11f8);
                auVar3._0_4_ = (ray->super_RayK<1>).tfar;
                auVar3._4_4_ = (ray->super_RayK<1>).mask;
                auVar3._8_4_ = (ray->super_RayK<1>).id;
                auVar3._12_4_ = (ray->super_RayK<1>).flags;
                auVar95 = ZEXT1664(auVar3);
                uVar10 = vextractps_avx(auVar3,1);
              }
              if ((((local_11f8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_11f8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_11f8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_11f8[0xf]) goto LAB_00b6760c;
              auVar39._8_4_ = 0x7f800000;
              auVar39._0_8_ = 0x7f8000007f800000;
              auVar39._12_4_ = 0x7f800000;
              auVar88 = vblendvps_avx(auVar39,auVar30._0_16_,local_11f8);
              auVar76 = vshufps_avx(auVar88,auVar88,0xb1);
              auVar76 = vminps_avx(auVar76,auVar88);
              auVar89 = vshufpd_avx(auVar76,auVar76,1);
              auVar76 = vminps_avx(auVar89,auVar76);
              auVar76 = vcmpps_avx(auVar88,auVar76,0);
              auVar89 = local_11f8 & auVar76;
              auVar88 = local_11f8;
              if ((((auVar89 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar89 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar89 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar89[0xf] < '\0') {
                auVar88 = vandps_avx(auVar76,local_11f8);
              }
              uVar11 = vmovmskps_avx(auVar88);
              uVar21 = CONCAT44((int)((ulong)pbVar12 >> 0x20),uVar11);
              pbVar12 = (byte *)0x0;
              lVar15 = local_1248;
              if (uVar21 != 0) {
                for (; (uVar21 >> (long)pbVar12 & 1) == 0; pbVar12 = pbVar12 + 1) {
                }
              }
              goto LAB_00b67272;
            }
          }
LAB_00b6760c:
          auVar101 = ZEXT1664(local_fe8);
          auVar113 = ZEXT1664(local_ff8);
          auVar119 = ZEXT1664(local_1008);
          auVar121 = ZEXT1664(local_1018);
          auVar125 = ZEXT1664(local_1028);
          auVar128 = ZEXT1664(local_1038);
          auVar133 = ZEXT1664(local_1048);
          auVar140 = ZEXT1664(local_1058);
          auVar150 = ZEXT1664(local_1068);
          auVar95 = ZEXT1664(local_1138);
        }
        fVar31 = (ray->super_RayK<1>).tfar;
        auVar30 = ZEXT1664(CONCAT412(fVar31,CONCAT48(fVar31,CONCAT44(fVar31,fVar31))));
      }
      goto LAB_00b66ab9;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }